

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

void __thiscall chrono::ChBody::VariablesFbLoadForces(ChBody *this,double factor)

{
  ChVariablesBodyOwnMass *this_00;
  Index index;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ChVector<double> v;
  undefined1 local_48 [16];
  double local_38;
  ChVectorRef local_30;
  
  this_00 = &this->variables;
  ChVariables::Get_fb((ChVectorRef *)local_48,(ChVariables *)this_00);
  if (2 < (long)local_48._8_8_) {
    uVar1 = 3;
    if (((local_48._0_8_ & 7) == 0) &&
       (uVar2 = (ulong)(-((uint)((ulong)local_48._0_8_ >> 3) & 0x1fffffff) & 7), uVar2 < 3)) {
      uVar1 = uVar2;
    }
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        *(double *)(local_48._0_8_ + uVar2 * 8) =
             factor * (this->Xforce).m_data[uVar2] + *(double *)(local_48._0_8_ + uVar2 * 8);
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    if (uVar1 < 3) {
      do {
        *(double *)(local_48._0_8_ + uVar1 * 8) =
             factor * (this->Xforce).m_data[uVar1] + *(double *)(local_48._0_8_ + uVar1 * 8);
        uVar1 = uVar1 + 1;
      } while (uVar1 != 3);
    }
    if ((this->bflags & 0x800) == 0) {
      local_48._0_8_ = (this->Xtorque).m_data[0] - (this->gyro).m_data[0];
      local_48._8_8_ = (this->Xtorque).m_data[1] - (this->gyro).m_data[1];
      local_38 = (this->Xtorque).m_data[2] - (this->gyro).m_data[2];
      ChVariables::Get_fb(&local_30,(ChVariables *)this_00);
      if (5 < (long)local_30.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ._8_8_) {
        uVar2 = local_30.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._0_8_ + 0x18;
        uVar1 = 3;
        if (((uVar2 & 7) == 0) &&
           (uVar3 = (ulong)(-((uint)(uVar2 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
          uVar1 = uVar3;
        }
        if (uVar1 != 0) {
          uVar3 = 0;
          do {
            *(double *)(uVar2 + uVar3 * 8) =
                 factor * *(double *)(local_48 + uVar3 * 8) + *(double *)(uVar2 + uVar3 * 8);
            uVar3 = uVar3 + 1;
          } while (uVar1 != uVar3);
        }
        if (uVar1 < 3) {
          do {
            *(double *)(uVar2 + uVar1 * 8) =
                 factor * *(double *)(local_48 + uVar1 * 8) + *(double *)(uVar2 + uVar1 * 8);
            uVar1 = uVar1 + 1;
          } while (uVar1 != 3);
        }
        return;
      }
    }
    else {
      ChVariables::Get_fb((ChVectorRef *)local_48,(ChVariables *)this_00);
      if (5 < (long)local_48._8_8_) {
        uVar2 = local_48._0_8_ + 0x18;
        uVar1 = 3;
        if (((uVar2 & 7) == 0) &&
           (uVar3 = (ulong)(-((uint)(uVar2 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
          uVar1 = uVar3;
        }
        if (uVar1 != 0) {
          uVar3 = 0;
          do {
            *(double *)(uVar2 + uVar3 * 8) =
                 factor * (this->Xtorque).m_data[uVar3] + *(double *)(uVar2 + uVar3 * 8);
            uVar3 = uVar3 + 1;
          } while (uVar1 != uVar3);
        }
        if (2 < uVar1) {
          return;
        }
        do {
          *(double *)(uVar2 + uVar1 * 8) =
               factor * (this->Xtorque).m_data[uVar1] + *(double *)(uVar2 + uVar1 * 8);
          uVar1 = uVar1 + 1;
        } while (uVar1 != 3);
        return;
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChBody::VariablesFbLoadForces(double factor) {
    // add applied forces to 'fb' vector
    this->variables.Get_fb().segment(0, 3) += factor * Xforce.eigen();

    // add applied torques to 'fb' vector, including gyroscopic torque
    if (this->GetNoGyroTorque())
        this->variables.Get_fb().segment(3, 3) += factor * Xtorque.eigen();
    else
        this->variables.Get_fb().segment(3, 3) += factor * (Xtorque - gyro).eigen();
}